

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  void *pvVar2;
  byte *pbVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  size_t dvs;
  ulong uVar10;
  int *piVar11;
  void *pvVar12;
  long *plVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong *puVar18;
  uint uVar19;
  ulong *puVar20;
  ulong *puVar21;
  long lVar22;
  long lVar23;
  byte bVar24;
  ulong *puVar25;
  long lVar26;
  ulong uVar27;
  void *unaff_R14;
  long lVar28;
  
  if (nsize < 0xf1) {
    uVar16 = 0x20;
    if (0x16 < nsize) {
      uVar16 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar9 = *msp;
    bVar24 = (byte)(uVar16 >> 3);
    uVar17 = uVar9 >> (bVar24 & 0x1f);
    if ((uVar17 & 3) != 0) {
      uVar17 = (~uVar17 & 1) + (int)(uVar16 >> 3);
      lVar14 = (long)msp + (ulong)(uVar17 * 0x10) + 0x38;
      lVar22 = *(long *)((long)msp + (ulong)(uVar17 * 0x10) + 0x48);
      lVar28 = *(long *)(lVar22 + 0x10);
      if (lVar14 == lVar28) {
        *(uint *)msp = uVar9 & ~(1 << (uVar17 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar17 * 0x10) + 0x48) = lVar28;
        *(long *)(lVar28 + 0x18) = lVar14;
      }
      unaff_R14 = (void *)(lVar22 + 0x10);
      *(ulong *)(lVar22 + 8) = (ulong)(uVar17 * 8) + 3;
      pbVar3 = (byte *)(lVar22 + 8 + (ulong)(uVar17 * 8));
      *pbVar3 = *pbVar3 | 1;
      goto LAB_00140833;
    }
    uVar10 = *(ulong *)((long)msp + 8);
    bVar7 = true;
    if (uVar10 < uVar16) {
      if (uVar9 >> (bVar24 & 0x1f) != 0) {
        uVar19 = 2 << (bVar24 & 0x1f);
        uVar19 = (-uVar19 | uVar19) & uVar17 << (bVar24 & 0x1f);
        uVar17 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar19 = uVar17 << 4;
        lVar14 = (long)msp + (ulong)uVar19 + 0x38;
        lVar22 = *(long *)((long)msp + (ulong)uVar19 + 0x48);
        lVar28 = *(long *)(lVar22 + 0x10);
        if (lVar14 == lVar28) {
          *(uint *)msp = uVar9 & ~(1 << (uVar17 & 0x1f));
        }
        else {
          *(long *)((long)msp + (ulong)uVar19 + 0x48) = lVar28;
          *(long *)(lVar28 + 0x18) = lVar14;
        }
        unaff_R14 = (void *)(lVar22 + 0x10);
        uVar27 = (ulong)(uVar17 * 8);
        uVar15 = uVar27 - uVar16;
        if (uVar15 < 0x20) {
          *(ulong *)(lVar22 + 8) = uVar27 | 3;
          pbVar3 = (byte *)(lVar22 + 8 + uVar27);
          *pbVar3 = *pbVar3 | 1;
        }
        else {
          *(ulong *)(lVar22 + 8) = uVar16 | 3;
          *(ulong *)(lVar22 + 8 + uVar16) = uVar15 | 1;
          *(ulong *)(lVar22 + uVar27) = uVar15;
          if (uVar10 != 0) {
            lVar28 = *(long *)((long)msp + 0x18);
            uVar10 = uVar10 >> 3;
            lVar14 = (long)msp + uVar10 * 0x10 + 0x38;
            if ((*msp >> ((uint)uVar10 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << ((byte)uVar10 & 0x1f);
              lVar23 = lVar14;
            }
            else {
              lVar23 = *(long *)(lVar14 + 0x10);
            }
            *(long *)(lVar14 + 0x10) = lVar28;
            *(long *)(lVar23 + 0x18) = lVar28;
            *(long *)(lVar28 + 0x10) = lVar23;
            *(long *)(lVar28 + 0x18) = lVar14;
          }
          *(ulong *)((long)msp + 8) = uVar15;
          *(ulong *)((long)msp + 0x18) = lVar22 + uVar16;
        }
        goto LAB_00140833;
      }
      uVar17 = *(uint *)((long)msp + 4);
      if (uVar17 != 0) {
        uVar19 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        lVar22 = *(long *)((long)msp + (ulong)uVar19 * 8 + 0x248);
        uVar15 = (*(ulong *)(lVar22 + 8) & 0xfffffffffffffffc) - uVar16;
        lVar28 = lVar22;
        while( true ) {
          lVar14 = *(long *)(lVar22 + 0x20);
          if (lVar14 == 0) {
            lVar14 = *(long *)(lVar22 + 0x28);
          }
          if (lVar14 == 0) break;
          uVar27 = (*(ulong *)(lVar14 + 8) & 0xfffffffffffffffc) - uVar16;
          lVar22 = lVar14;
          if (uVar27 < uVar15) {
            uVar15 = uVar27;
            lVar28 = lVar14;
          }
        }
        lVar22 = *(long *)(lVar28 + 0x18);
        lVar14 = *(long *)(lVar28 + 0x30);
        if (lVar22 == lVar28) {
          lVar22 = *(long *)(lVar28 + 0x28);
          if (lVar22 != 0) {
            plVar13 = (long *)(lVar28 + 0x28);
LAB_0014123a:
            do {
              if (*(long *)(lVar22 + 0x28) == 0) {
                if (*(long *)(lVar22 + 0x20) == 0) goto code_r0x0014124e;
                plVar13 = (long *)(lVar22 + 0x20);
              }
              else {
                plVar13 = (long *)(lVar22 + 0x28);
              }
              lVar22 = *plVar13;
            } while( true );
          }
          lVar22 = *(long *)(lVar28 + 0x20);
          if (lVar22 != 0) {
            plVar13 = (long *)(lVar28 + 0x20);
            goto LAB_0014123a;
          }
          lVar22 = 0;
        }
        else {
          lVar23 = *(long *)(lVar28 + 0x10);
          *(long *)(lVar23 + 0x18) = lVar22;
          *(long *)(lVar22 + 0x10) = lVar23;
        }
        goto LAB_00141255;
      }
    }
    goto LAB_0014095e;
  }
  uVar16 = 0xffffffffffffffff;
  if (nsize < 0xffffffffffffff80) {
    uVar16 = nsize + 0xf & 0xfffffffffffffff8;
    uVar9 = *(uint *)((long)msp + 4);
    if (uVar9 != 0) {
      uVar17 = (uint)(nsize + 0xf >> 8);
      if (uVar17 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0x1f;
        if (uVar17 < 0x10000) {
          uVar19 = 0x1f;
          if (uVar17 != 0) {
            for (; uVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
            }
          }
          uVar10 = (ulong)((uVar16 >> ((ulong)(byte)(0x26 - (char)(uVar19 ^ 0x1f)) & 0x3f) & 1) != 0
                          ) | (ulong)((uVar19 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      uVar15 = -uVar16;
      lVar22 = *(long *)((long)msp + uVar10 * 8 + 0x248);
      lVar28 = 0;
      if (lVar22 == 0) {
        lVar22 = 0;
      }
      else {
        bVar24 = 0x39 - (char)(uVar10 >> 1);
        if (uVar10 == 0x1f) {
          bVar24 = 0;
        }
        lVar14 = uVar16 << (bVar24 & 0x3f);
        lVar23 = 0;
        do {
          uVar27 = (*(ulong *)(lVar22 + 8) & 0xfffffffffffffffc) - uVar16;
          if ((uVar27 < uVar15) && (uVar15 = uVar27, lVar28 = lVar22, uVar27 == 0)) {
            bVar7 = false;
            uVar15 = 0;
          }
          else {
            lVar6 = *(long *)(lVar22 + 0x28);
            lVar22 = *(long *)(lVar22 + 0x20 + (lVar14 >> 0x3f) * -8);
            lVar26 = lVar6;
            if (lVar6 == lVar22) {
              lVar26 = lVar23;
            }
            if (lVar6 != 0) {
              lVar23 = lVar26;
            }
            if (lVar22 == 0) {
              bVar7 = false;
              lVar22 = lVar23;
            }
            else {
              lVar14 = lVar14 * 2;
              bVar7 = true;
            }
          }
        } while (bVar7);
      }
      if (lVar22 == 0 && lVar28 == 0) {
        uVar17 = 2 << ((byte)uVar10 & 0x1f);
        uVar17 = (-uVar17 | uVar17) & uVar9;
        if (uVar17 == 0) {
          lVar22 = 0;
        }
        else {
          uVar19 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          lVar22 = *(long *)((long)msp + (ulong)uVar19 * 8 + 0x248);
        }
      }
      while (lVar14 = lVar22, lVar14 != 0) {
        uVar27 = (*(ulong *)(lVar14 + 8) & 0xfffffffffffffffc) - uVar16;
        uVar10 = uVar27;
        if (uVar15 <= uVar27) {
          uVar10 = uVar15;
        }
        if (uVar15 > uVar27) {
          lVar28 = lVar14;
        }
        uVar15 = uVar10;
        lVar22 = *(long *)(lVar14 + 0x20);
        if (*(long *)(lVar14 + 0x20) == 0) {
          lVar22 = *(long *)(lVar14 + 0x28);
        }
      }
      if ((lVar28 != 0) && (uVar15 < *(long *)((long)msp + 8) - uVar16)) {
        lVar22 = *(long *)(lVar28 + 0x18);
        lVar14 = *(long *)(lVar28 + 0x30);
        if (lVar22 == lVar28) {
          lVar22 = *(long *)(lVar28 + 0x28);
          if (lVar22 != 0) {
            plVar13 = (long *)(lVar28 + 0x28);
LAB_00140ec8:
            do {
              if (*(long *)(lVar22 + 0x28) == 0) {
                if (*(long *)(lVar22 + 0x20) == 0) goto code_r0x00140edc;
                plVar13 = (long *)(lVar22 + 0x20);
              }
              else {
                plVar13 = (long *)(lVar22 + 0x28);
              }
              lVar22 = *plVar13;
            } while( true );
          }
          lVar22 = *(long *)(lVar28 + 0x20);
          if (lVar22 != 0) {
            plVar13 = (long *)(lVar28 + 0x20);
            goto LAB_00140ec8;
          }
          lVar22 = 0;
        }
        else {
          lVar23 = *(long *)(lVar28 + 0x10);
          *(long *)(lVar23 + 0x18) = lVar22;
          *(long *)(lVar22 + 0x10) = lVar23;
        }
        goto LAB_00140ee3;
      }
      unaff_R14 = (void *)0x0;
      goto LAB_00141193;
    }
  }
  goto LAB_00140967;
code_r0x0014124e:
  *plVar13 = 0;
LAB_00141255:
  if (lVar14 != 0) {
    lVar23 = *(long *)(lVar28 + 0x38);
    if (lVar28 == *(long *)((long)msp + lVar23 * 8 + 0x248)) {
      *(long *)((long)msp + lVar23 * 8 + 0x248) = lVar22;
      if (lVar22 == 0) {
        *(uint *)((long)msp + 4) = uVar17 & ~(1 << ((uint)lVar23 & 0x1f));
        goto LAB_0014128e;
      }
    }
    else {
      if (*(long *)(lVar14 + 0x20) == lVar28) {
        *(long *)(lVar14 + 0x20) = lVar22;
      }
      else {
        *(long *)(lVar14 + 0x28) = lVar22;
      }
LAB_0014128e:
      if (lVar22 == 0) goto LAB_001412b9;
    }
    *(long *)(lVar22 + 0x30) = lVar14;
    lVar14 = *(long *)(lVar28 + 0x20);
    if (lVar14 != 0) {
      *(long *)(lVar22 + 0x20) = lVar14;
      *(long *)(lVar14 + 0x30) = lVar22;
    }
    lVar14 = *(long *)(lVar28 + 0x28);
    if (lVar14 != 0) {
      *(long *)(lVar22 + 0x28) = lVar14;
      *(long *)(lVar14 + 0x30) = lVar22;
    }
  }
LAB_001412b9:
  if (uVar15 < 0x20) {
    *(ulong *)(lVar28 + 8) = uVar15 + uVar16 | 3;
    pbVar3 = (byte *)(lVar28 + 8 + uVar15 + uVar16);
    *pbVar3 = *pbVar3 | 1;
  }
  else {
    *(ulong *)(lVar28 + 8) = uVar16 | 3;
    *(ulong *)(lVar28 + 8 + uVar16) = uVar15 | 1;
    *(ulong *)(lVar28 + uVar16 + uVar15) = uVar15;
    if (uVar10 != 0) {
      lVar22 = *(long *)((long)msp + 0x18);
      uVar10 = uVar10 >> 3;
      lVar14 = (long)msp + uVar10 * 0x10 + 0x38;
      if ((uVar9 >> ((uint)uVar10 & 0x1f) & 1) == 0) {
        *(uint *)msp = 1 << ((byte)uVar10 & 0x1f) | uVar9;
        lVar23 = lVar14;
      }
      else {
        lVar23 = *(long *)((long)msp + uVar10 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar10 * 0x10 + 0x48) = lVar22;
      *(long *)(lVar23 + 0x18) = lVar22;
      *(long *)(lVar22 + 0x10) = lVar23;
      *(long *)(lVar22 + 0x18) = lVar14;
    }
    *(ulong *)((long)msp + 8) = uVar15;
    *(ulong *)((long)msp + 0x18) = lVar28 + uVar16;
  }
  unaff_R14 = (void *)(lVar28 + 0x10);
LAB_00140833:
  bVar7 = false;
LAB_0014095e:
  if (!bVar7) {
    return unaff_R14;
  }
  goto LAB_00140967;
LAB_001413a1:
  if (*(long *)(lVar23 + 0x28) == 0) {
    if (*(long *)(lVar23 + 0x20) == 0) goto code_r0x001413b5;
    plVar13 = (long *)(lVar23 + 0x20);
  }
  else {
    plVar13 = (long *)(lVar23 + 0x28);
  }
  lVar23 = *plVar13;
  goto LAB_001413a1;
code_r0x001413b5:
  *plVar13 = 0;
LAB_001413bc:
  if (lVar6 != 0) {
    lVar26 = *(long *)(lVar14 + 0x38);
    if (lVar14 == *(long *)((long)msp + lVar26 * 8 + 0x248)) {
      *(long *)((long)msp + lVar26 * 8 + 0x248) = lVar23;
      if (lVar23 == 0) {
        bVar24 = (byte)lVar26 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar24 | 0xfffffffeU >> 0x20 - bVar24);
        goto LAB_001413fb;
      }
    }
    else {
      if (*(long *)(lVar6 + 0x20) == lVar14) {
        *(long *)(lVar6 + 0x20) = lVar23;
      }
      else {
        *(long *)(lVar6 + 0x28) = lVar23;
      }
LAB_001413fb:
      if (lVar23 == 0) goto LAB_00141426;
    }
    *(long *)(lVar23 + 0x30) = lVar6;
    lVar6 = *(long *)(lVar14 + 0x20);
    if (lVar6 != 0) {
      *(long *)(lVar23 + 0x20) = lVar6;
      *(long *)(lVar6 + 0x30) = lVar23;
    }
    lVar6 = *(long *)(lVar14 + 0x28);
    if (lVar6 != 0) {
      *(long *)(lVar23 + 0x28) = lVar6;
      *(long *)(lVar6 + 0x30) = lVar23;
    }
  }
LAB_00141426:
  lVar14 = lVar14 + (uVar16 & 0xfffffffffffffffc);
  uVar15 = uVar15 + (uVar16 & 0xfffffffffffffffc);
LAB_0014142c:
  *(byte *)(lVar14 + 8) = *(byte *)(lVar14 + 8) & 0xfe;
  *(ulong *)(lVar28 + 8) = uVar15 | 1;
  *(ulong *)(lVar28 + uVar15) = uVar15;
  if (uVar15 < 0x100) {
    uVar15 = uVar15 >> 3;
    lVar14 = (long)msp + uVar15 * 0x10 + 0x38;
    if ((*msp >> ((uint)uVar15 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar15 & 0x1f);
      lVar23 = lVar14;
    }
    else {
      lVar23 = *(long *)((long)msp + uVar15 * 0x10 + 0x48);
    }
    *(long *)((long)msp + uVar15 * 0x10 + 0x48) = lVar28;
    *(long *)(lVar23 + 0x18) = lVar28;
    *(long *)(lVar28 + 0x10) = lVar23;
    *(long *)(lVar28 + 0x18) = lVar14;
  }
  else {
    uVar9 = (uint)(uVar15 >> 8);
    if (uVar9 == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0x1f;
      if (uVar9 < 0x10000) {
        uVar17 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        uVar16 = (ulong)((uVar15 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f) & 1) != 0)
                 | (ulong)((uVar17 ^ 0x1f) * 2 ^ 0x3e);
      }
    }
    plVar13 = (long *)(uVar16 * 8 + 0x248 + (long)msp);
    *(ulong *)(lVar28 + 0x38) = uVar16;
    *(undefined8 *)(lVar28 + 0x20) = 0;
    *(undefined8 *)(lVar28 + 0x28) = 0;
    if ((*(uint *)((long)msp + 4) >> ((uint)uVar16 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar16 & 0x1f);
      *plVar13 = lVar28;
      *(long **)(lVar28 + 0x30) = plVar13;
      *(long *)(lVar28 + 0x18) = lVar28;
      *(long *)(lVar28 + 0x10) = lVar28;
    }
    else {
      lVar14 = *plVar13;
      bVar24 = 0x39 - (char)(uVar16 >> 1);
      if (uVar16 == 0x1f) {
        bVar24 = 0;
      }
      lVar23 = uVar15 << (bVar24 & 0x3f);
      do {
        if ((*(ulong *)(lVar14 + 8) & 0xfffffffffffffffc) == uVar15) {
          lVar23 = *(long *)(lVar14 + 0x10);
          *(long *)(lVar23 + 0x18) = lVar28;
          *(long *)(lVar14 + 0x10) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar23;
          *(long *)(lVar28 + 0x18) = lVar14;
          *(undefined8 *)(lVar28 + 0x30) = 0;
          break;
        }
        lVar6 = *(long *)(lVar14 + 0x20 + (lVar23 >> 0x3f) * -8);
        lVar26 = lVar6;
        if (lVar6 == 0) {
          *(long *)(lVar14 + 0x20 + (lVar23 >> 0x3f) * -8) = lVar28;
          *(long *)(lVar28 + 0x30) = lVar14;
          *(long *)(lVar28 + 0x18) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar28;
          lVar26 = lVar14;
        }
        lVar14 = lVar26;
        lVar23 = lVar23 * 2;
      } while (lVar6 != 0);
    }
  }
  goto LAB_00141207;
code_r0x00140edc:
  *plVar13 = 0;
LAB_00140ee3:
  if (lVar14 != 0) {
    lVar23 = *(long *)(lVar28 + 0x38);
    if (lVar28 == *(long *)((long)msp + lVar23 * 8 + 0x248)) {
      *(long *)((long)msp + lVar23 * 8 + 0x248) = lVar22;
      if (lVar22 == 0) {
        *(uint *)((long)msp + 4) = uVar9 & ~(1 << ((uint)lVar23 & 0x1f));
        goto LAB_00140f14;
      }
    }
    else {
      if (*(long *)(lVar14 + 0x20) == lVar28) {
        *(long *)(lVar14 + 0x20) = lVar22;
      }
      else {
        *(long *)(lVar14 + 0x28) = lVar22;
      }
LAB_00140f14:
      if (lVar22 == 0) goto LAB_00140f3f;
    }
    *(long *)(lVar22 + 0x30) = lVar14;
    lVar14 = *(long *)(lVar28 + 0x20);
    if (lVar14 != 0) {
      *(long *)(lVar22 + 0x20) = lVar14;
      *(long *)(lVar14 + 0x30) = lVar22;
    }
    lVar14 = *(long *)(lVar28 + 0x28);
    if (lVar14 != 0) {
      *(long *)(lVar22 + 0x28) = lVar14;
      *(long *)(lVar14 + 0x30) = lVar22;
    }
  }
LAB_00140f3f:
  if (uVar15 < 0x20) {
    *(ulong *)(lVar28 + 8) = uVar15 + uVar16 | 3;
    pbVar3 = (byte *)(lVar28 + 8 + uVar15 + uVar16);
    *pbVar3 = *pbVar3 | 1;
  }
  else {
    lVar22 = lVar28 + uVar16;
    *(ulong *)(lVar28 + 8) = uVar16 | 3;
    *(ulong *)(lVar28 + 8 + uVar16) = uVar15 | 1;
    *(ulong *)(lVar22 + uVar15) = uVar15;
    if (uVar15 < 0x100) {
      uVar15 = uVar15 >> 3;
      lVar14 = (long)msp + uVar15 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar15 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar15 & 0x1f);
        lVar23 = lVar14;
      }
      else {
        lVar23 = *(long *)((long)msp + uVar15 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar15 * 0x10 + 0x48) = lVar22;
      *(long *)(lVar23 + 0x18) = lVar22;
      *(long *)(lVar22 + 0x10) = lVar23;
      *(long *)(lVar22 + 0x18) = lVar14;
    }
    else {
      uVar9 = (uint)(uVar15 >> 8);
      if (uVar9 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0x1f;
        if (uVar9 < 0x10000) {
          uVar17 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar10 = (ulong)((uint)((uVar15 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f) &
                                  1) != 0) | (uVar17 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      plVar13 = (long *)((long)msp + uVar10 * 8 + 0x248);
      *(ulong *)(lVar22 + 0x38) = uVar10;
      *(undefined8 *)(lVar22 + 0x20) = 0;
      *(undefined8 *)(lVar22 + 0x28) = 0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar10 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar10 & 0x1f);
        *plVar13 = lVar22;
        *(long **)(lVar22 + 0x30) = plVar13;
        *(long *)(lVar22 + 0x18) = lVar22;
        *(long *)(lVar22 + 0x10) = lVar22;
      }
      else {
        lVar14 = *plVar13;
        bVar24 = 0x39 - (char)(uVar10 >> 1);
        if (uVar10 == 0x1f) {
          bVar24 = 0;
        }
        lVar23 = uVar15 << (bVar24 & 0x3f);
        do {
          if ((*(ulong *)(lVar14 + 8) & 0xfffffffffffffffc) == uVar15) {
            lVar23 = *(long *)(lVar14 + 0x10);
            *(long *)(lVar23 + 0x18) = lVar22;
            *(long *)(lVar14 + 0x10) = lVar22;
            *(long *)(lVar22 + 0x10) = lVar23;
            *(long *)(lVar22 + 0x18) = lVar14;
            *(undefined8 *)(lVar22 + 0x30) = 0;
            break;
          }
          lVar6 = *(long *)(lVar14 + 0x20 + (lVar23 >> 0x3f) * -8);
          lVar26 = lVar6;
          if (lVar6 == 0) {
            *(long *)(lVar14 + 0x20 + (lVar23 >> 0x3f) * -8) = lVar22;
            *(long *)(lVar22 + 0x30) = lVar14;
            *(long *)(lVar22 + 0x18) = lVar22;
            *(long *)(lVar22 + 0x10) = lVar22;
            lVar26 = lVar14;
          }
          lVar14 = lVar26;
          lVar23 = lVar23 * 2;
        } while (lVar6 != 0);
      }
    }
  }
  unaff_R14 = (void *)(lVar28 + 0x10);
LAB_00141193:
  if (unaff_R14 != (void *)0x0) {
    return unaff_R14;
  }
LAB_00140967:
  uVar10 = *(ulong *)((long)msp + 8);
  uVar15 = uVar10 - uVar16;
  if (uVar10 < uVar16) {
    uVar10 = *(ulong *)((long)msp + 0x10) - uVar16;
    if (*(ulong *)((long)msp + 0x10) < uVar16 || uVar10 == 0) {
      if ((0x1ffff < uVar16) && (unaff_R14 = direct_alloc(uVar16), unaff_R14 != (void *)0x0)) {
        return unaff_R14;
      }
      uVar10 = uVar16 + 0x20040 & 0xfffffffffffe0000;
      if (uVar16 < uVar10) {
        piVar11 = __errno_location();
        iVar4 = *piVar11;
        pvVar12 = mmap64((void *)0x0,uVar10,3,0x62,-1,0);
        *piVar11 = iVar4;
        if (pvVar12 == (void *)0xffffffffffffffff) {
          uVar10 = 0;
        }
      }
      else {
        pvVar12 = (void *)0xffffffffffffffff;
        uVar10 = 0;
      }
      if (pvVar12 != (void *)0xffffffffffffffff) {
        puVar21 = (ulong *)((long)msp + 0x348);
        puVar18 = puVar21;
        do {
          pvVar2 = (void *)((long)*puVar18 + puVar18[1]);
          if (pvVar12 == pvVar2) {
            pvVar5 = *(void **)((long)msp + 0x20);
            if (pvVar5 < pvVar2 && (void *)*puVar18 <= pvVar5) {
              puVar18[1] = puVar18[1] + uVar10;
              lVar22 = uVar10 + *(long *)((long)msp + 0x10);
              uVar10 = (ulong)(-(int)pvVar5 - 0x10U & 7);
              uVar15 = lVar22 - uVar10;
              *(ulong *)((long)msp + 0x20) = (long)pvVar5 + uVar10;
              *(ulong *)((long)msp + 0x10) = uVar15;
              *(ulong *)((long)pvVar5 + uVar10 + 8) = uVar15 | 1;
              *(undefined8 *)((long)pvVar5 + lVar22 + 8) = 0x40;
              *(undefined8 *)((long)msp + 0x28) = 0x200000;
              goto LAB_001411db;
            }
            break;
          }
          puVar18 = (ulong *)puVar18[2];
        } while (puVar18 != (ulong *)0x0);
        puVar18 = puVar21;
        do {
          uVar15 = *puVar18;
          if (uVar15 == (long)pvVar12 + uVar10) {
            *puVar18 = (ulong)pvVar12;
            puVar18[1] = puVar18[1] + uVar10;
            uVar10 = (ulong)(-(int)pvVar12 - 0x10U & 7);
            lVar22 = (long)pvVar12 + uVar10;
            lVar14 = (-(int)uVar15 - 0x10U & 7) + uVar15;
            lVar28 = lVar22 + uVar16;
            uVar15 = lVar14 - lVar28;
            *(ulong *)((long)pvVar12 + uVar10 + 8) = uVar16 | 3;
            if (lVar14 == *(long *)((long)msp + 0x20)) {
              uVar15 = uVar15 + *(long *)((long)msp + 0x10);
              *(ulong *)((long)msp + 0x10) = uVar15;
              *(long *)((long)msp + 0x20) = lVar28;
              *(ulong *)(lVar28 + 8) = uVar15 | 1;
              goto LAB_00141207;
            }
            if (lVar14 == *(long *)((long)msp + 0x18)) {
              uVar15 = uVar15 + *(long *)((long)msp + 8);
              *(ulong *)((long)msp + 8) = uVar15;
              *(long *)((long)msp + 0x18) = lVar28;
              *(ulong *)(lVar28 + 8) = uVar15 | 1;
              *(ulong *)(lVar28 + uVar15) = uVar15;
              goto LAB_00141207;
            }
            uVar16 = *(ulong *)(lVar14 + 8);
            if ((uVar16 & 2) != 0) goto LAB_0014142c;
            lVar23 = *(long *)(lVar14 + 0x18);
            if (uVar16 < 0x100) {
              lVar6 = *(long *)(lVar14 + 0x10);
              if (lVar6 == lVar23) {
                bVar24 = (byte)(uVar16 >> 3) & 0x1f;
                *(uint *)msp = *msp & (-2 << bVar24 | 0xfffffffeU >> 0x20 - bVar24);
              }
              else {
                *(long *)(lVar6 + 0x18) = lVar23;
                *(long *)(lVar23 + 0x10) = lVar6;
              }
              goto LAB_00141426;
            }
            lVar6 = *(long *)(lVar14 + 0x30);
            if (lVar23 != lVar14) {
              lVar26 = *(long *)(lVar14 + 0x10);
              *(long *)(lVar26 + 0x18) = lVar23;
              *(long *)(lVar23 + 0x10) = lVar26;
              goto LAB_001413bc;
            }
            lVar23 = *(long *)(lVar14 + 0x28);
            if (lVar23 != 0) {
              plVar13 = (long *)(lVar14 + 0x28);
              goto LAB_001413a1;
            }
            lVar23 = *(long *)(lVar14 + 0x20);
            if (lVar23 != 0) {
              plVar13 = (long *)(lVar14 + 0x20);
              goto LAB_001413a1;
            }
            lVar23 = 0;
            goto LAB_001413bc;
          }
          puVar18 = (ulong *)puVar18[2];
        } while (puVar18 != (ulong *)0x0);
        puVar18 = *(ulong **)((long)msp + 0x20);
        for (puVar25 = puVar21;
            (puVar18 < (ulong *)*puVar25 ||
            (puVar20 = (ulong *)((long)*puVar25 + puVar25[1]), puVar20 <= puVar18));
            puVar25 = (ulong *)puVar25[2]) {
        }
        puVar25 = (ulong *)((long)puVar20 + ((ulong)(0x37U - (int)puVar20 & 7) - 0x47));
        if (puVar25 < puVar18 + 4) {
          puVar25 = puVar18;
        }
        uVar15 = (ulong)(-(int)pvVar12 - 0x10U & 7);
        uVar27 = (uVar10 - 0x40) - uVar15;
        *(ulong *)((long)msp + 0x20) = (long)pvVar12 + uVar15;
        *(ulong *)((long)msp + 0x10) = uVar27;
        *(ulong *)((long)pvVar12 + uVar15 + 8) = uVar27 | 1;
        *(undefined8 *)((long)pvVar12 + (uVar10 - 0x38)) = 0x40;
        *(undefined8 *)((long)msp + 0x28) = 0x200000;
        puVar25[1] = 0x23;
        uVar15 = *(ulong *)((long)msp + 0x350);
        puVar25[2] = *puVar21;
        puVar25[3] = uVar15;
        puVar25[4] = *(ulong *)((long)msp + 0x358);
        *(void **)((long)msp + 0x348) = pvVar12;
        *(ulong *)((long)msp + 0x350) = uVar10;
        *(ulong **)((long)msp + 0x358) = puVar25 + 2;
        puVar21 = puVar25 + 4;
        do {
          puVar21[1] = 0xb;
          puVar1 = puVar21 + 2;
          puVar21 = puVar21 + 1;
        } while (puVar1 < puVar20);
        uVar10 = (long)puVar25 - (long)puVar18;
        if (uVar10 != 0) {
          *(byte *)(puVar25 + 1) = (byte)puVar25[1] & 0xfe;
          puVar18[1] = uVar10 | 1;
          *puVar25 = uVar10;
          if (uVar10 < 0x100) {
            uVar10 = uVar10 >> 3;
            uVar15 = (long)msp + uVar10 * 0x10 + 0x38;
            if ((*msp >> ((uint)uVar10 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << ((byte)uVar10 & 0x1f);
              uVar27 = uVar15;
            }
            else {
              uVar27 = *(ulong *)((long)msp + uVar10 * 0x10 + 0x48);
            }
            *(ulong **)((long)msp + uVar10 * 0x10 + 0x48) = puVar18;
            *(ulong **)(uVar27 + 0x18) = puVar18;
            puVar18[2] = uVar27;
            puVar18[3] = uVar15;
          }
          else {
            uVar9 = (uint)(uVar10 >> 8);
            if (uVar9 == 0) {
              uVar15 = 0;
            }
            else {
              uVar15 = 0x1f;
              if (uVar9 < 0x10000) {
                uVar17 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> uVar17 == 0; uVar17 = uVar17 - 1) {
                  }
                }
                uVar15 = (ulong)((uint)((uVar10 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) &
                                                   0x3f) & 1) != 0) | (uVar17 ^ 0x1f) * 2 ^ 0x3e);
              }
            }
            puVar21 = (ulong *)(uVar15 * 8 + 0x248 + (long)msp);
            puVar18[7] = uVar15;
            puVar18[4] = 0;
            puVar18[5] = 0;
            if ((*(uint *)((long)msp + 4) >> ((uint)uVar15 & 0x1f) & 1) == 0) {
              *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar15 & 0x1f);
              *puVar21 = (ulong)puVar18;
              puVar18[6] = (ulong)puVar21;
              puVar18[3] = (ulong)puVar18;
              puVar18[2] = (ulong)puVar18;
            }
            else {
              uVar27 = *puVar21;
              bVar24 = 0x39 - (char)(uVar15 >> 1);
              if (uVar15 == 0x1f) {
                bVar24 = 0;
              }
              lVar22 = uVar10 << (bVar24 & 0x3f);
              do {
                if ((*(ulong *)(uVar27 + 8) & 0xfffffffffffffffc) == uVar10) {
                  uVar10 = *(ulong *)(uVar27 + 0x10);
                  *(ulong **)(uVar10 + 0x18) = puVar18;
                  *(ulong **)(uVar27 + 0x10) = puVar18;
                  puVar18[2] = uVar10;
                  puVar18[3] = uVar27;
                  puVar18[6] = 0;
                  break;
                }
                uVar15 = *(ulong *)(uVar27 + 0x20 + (lVar22 >> 0x3f) * -8);
                uVar8 = uVar15;
                if (uVar15 == 0) {
                  *(ulong **)(uVar27 + 0x20 + (lVar22 >> 0x3f) * -8) = puVar18;
                  puVar18[6] = uVar27;
                  puVar18[3] = (ulong)puVar18;
                  puVar18[2] = (ulong)puVar18;
                  uVar8 = uVar27;
                }
                uVar27 = uVar8;
                lVar22 = lVar22 * 2;
              } while (uVar15 != 0);
            }
          }
        }
LAB_001411db:
        bVar7 = true;
        uVar10 = *(ulong *)((long)msp + 0x10) - uVar16;
        if (uVar16 <= *(ulong *)((long)msp + 0x10) && uVar10 != 0) {
          *(ulong *)((long)msp + 0x10) = uVar10;
          lVar22 = *(long *)((long)msp + 0x20);
          *(ulong *)((long)msp + 0x20) = lVar22 + uVar16;
          *(ulong *)(lVar22 + 8 + uVar16) = uVar10 | 1;
          *(ulong *)(lVar22 + 8) = uVar16 | 3;
LAB_00141207:
          unaff_R14 = (void *)(lVar22 + 0x10);
          bVar7 = false;
        }
        if (!bVar7) {
          return unaff_R14;
        }
      }
      return (void *)0x0;
    }
    *(ulong *)((long)msp + 0x10) = uVar10;
    lVar22 = *(long *)((long)msp + 0x20);
    *(ulong *)((long)msp + 0x20) = lVar22 + uVar16;
    *(ulong *)(lVar22 + 8 + uVar16) = uVar10 | 1;
  }
  else {
    lVar22 = *(long *)((long)msp + 0x18);
    if (uVar15 < 0x20) {
      *(undefined8 *)((long)msp + 8) = 0;
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(ulong *)(lVar22 + 8) = uVar10 | 3;
      pbVar3 = (byte *)(lVar22 + 8 + uVar10);
      *pbVar3 = *pbVar3 | 1;
      goto LAB_00140a7d;
    }
    *(ulong *)((long)msp + 0x18) = lVar22 + uVar16;
    *(ulong *)((long)msp + 8) = uVar15;
    *(ulong *)(lVar22 + 8 + uVar16) = uVar15 | 1;
    *(ulong *)(lVar22 + uVar10) = uVar15;
  }
  *(ulong *)(lVar22 + 8) = uVar16 | 3;
LAB_00140a7d:
  return (void *)(lVar22 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}